

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> * __thiscall
Blob_Detection::BlobDetection::find
          (BlobDetection *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
          BlobParameters parameter,uint8_t threshold)

{
  value_type vVar1;
  value_type vVar2;
  bool bVar3;
  list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *this_00;
  uchar *puVar4;
  reference puVar5;
  reference this_01;
  reference pvVar6;
  BlobInfo *pBVar7;
  uchar *puVar8;
  BlobInfo *pBVar9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  iterator iVar12;
  iterator iVar13;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *pvVar14;
  int in_ECX;
  uint in_EDX;
  ImageTemplate<unsigned_char> *in_RSI;
  BlobDetection *in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar15 [64];
  byte in_stack_00000010;
  byte in_stack_00000020;
  byte in_stack_00000030;
  byte in_stack_00000040;
  byte in_stack_0000004c;
  byte in_stack_00000054;
  byte in_stack_00000060;
  byte in_stack_00000070;
  byte in_stack_0000007c;
  byte in_stack_00000084;
  byte in_stack_0000008c;
  byte in_stack_00000094;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> blobTemp;
  uint8_t *position_1;
  uint32_t yMap_1;
  uint32_t xMap_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *contourY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *contourX;
  uint8_t *position;
  uint8_t neighbourCount;
  uint32_t yMap;
  uint32_t xMap;
  size_t pointId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *edgeY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *edgeX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pointY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pointX;
  uint32_t relativePosition;
  BlobInfo *newBlob;
  const_iterator endMap;
  list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> foundBlob;
  iterator mapValueY;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  iterator mapValueX;
  uint32_t mapWidth;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imageMap;
  list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
  *in_stack_fffffffffffffbe8;
  BlobInfo *in_stack_fffffffffffffbf0;
  value_type *in_stack_fffffffffffffbf8;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffc00;
  size_type in_stack_fffffffffffffc08;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffc10;
  allocator_type *in_stack_fffffffffffffc18;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
  *in_stack_fffffffffffffc20;
  _List_iterator<Blob_Detection::BlobInfo> in_stack_fffffffffffffc28;
  _List_iterator<Blob_Detection::BlobInfo> in_stack_fffffffffffffc30;
  anon_class_8_1_8a173a49 __pred;
  char local_229;
  BlobInfo *local_220;
  undefined1 local_b0 [40];
  byte *local_88;
  uchar *local_80;
  uchar *local_78;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  uint local_64;
  byte *local_60;
  byte *local_58;
  uint32_t local_50;
  undefined1 local_3a [58];
  
  local_3a._26_4_ = in_R9D;
  local_3a._30_4_ = in_R8D;
  local_3a._34_4_ = in_ECX;
  local_3a._38_4_ = in_EDX;
  local_3a._42_8_ = in_RSI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffc10,(uint32_t)(in_stack_fffffffffffffc08 >> 0x20),
             (uint32_t)in_stack_fffffffffffffc08,
             (uint32_t)((ulong)in_stack_fffffffffffffc00 >> 0x20),
             (uint32_t)in_stack_fffffffffffffc00);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffc00);
  BlobParameters::_verify((BlobParameters *)in_stack_fffffffffffffbf0);
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::clear
            ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)0x12a031
            );
  this_00 = (list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
            (ulong)((local_3a._30_4_ + 2) * (local_3a._26_4_ + 2));
  local_3a[1] = 0;
  __pred.parameter = (BlobParameters *)local_3a;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x12a067);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc10,
             in_stack_fffffffffffffc08,(value_type_conflict *)in_stack_fffffffffffffc00,
             (allocator_type *)in_stack_fffffffffffffbf8);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x12a095);
  local_50 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize
                       ((ImageTemplate<unsigned_char> *)local_3a._42_8_);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data
                     ((ImageTemplate<unsigned_char> *)local_3a._42_8_);
  local_58 = puVar4 + (ulong)(uint)local_3a._38_4_ + (ulong)(local_3a._34_4_ * local_50);
  local_60 = local_58 + local_3a._26_4_ * local_50;
  local_64 = local_3a._30_4_ + 2;
  local_80 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffbe8);
  local_78 = (uchar *)__gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                   *)in_stack_fffffffffffffbf8,
                                  (difference_type)in_stack_fffffffffffffbf0);
  local_70 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffbf8,(difference_type)in_stack_fffffffffffffbf0);
  while (local_58 != local_60) {
    local_88 = local_58;
    local_b0._32_8_ = local_58 + (uint)local_3a._30_4_;
    local_b0._24_8_ = local_70._M_current;
    while (local_88 != (byte *)local_b0._32_8_) {
      if ((byte)blobTemp.
                super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                ._M_impl.super__Vector_impl_data._M_start <= *local_88) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)(local_b0 + 0x18));
        *puVar5 = '\x01';
      }
      local_88 = local_88 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)(local_b0 + 0x18));
    }
    local_58 = local_58 + local_50;
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator+=(&local_70,(ulong)local_64);
  }
  std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::list
            ((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)0x12a2b0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  local_70 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffbf8,(difference_type)in_stack_fffffffffffffbf0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  __gnu_cxx::
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
  operator-((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)in_stack_fffffffffffffbf8,(difference_type)in_stack_fffffffffffffbf0);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffbf0,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffbe8);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffffbf0,
                            (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)in_stack_fffffffffffffbe8), bVar3) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_70);
    if (*puVar5 == '\x01') {
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      vmovdqu64_avx512f(auVar15);
      vmovdqu64_avx512f(auVar15);
      vmovdqu64_avx512f(auVar15);
      vmovdqu64_avx512f(auVar15);
      BlobInfo::BlobInfo((BlobInfo *)in_stack_fffffffffffffc30._M_node);
      std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::
      push_back((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      BlobInfo::~BlobInfo(in_stack_fffffffffffffbf0);
      this_01 = std::__cxx11::
                list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::back
                          ((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                            *)in_stack_fffffffffffffbf0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8)
      ;
      __gnu_cxx::operator-
                ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffbf0,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffbe8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_stack_fffffffffffffbf0->_pointX,
                 (value_type_conflict3 *)in_stack_fffffffffffffbe8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_stack_fffffffffffffbf0->_pointX,
                 (value_type_conflict3 *)in_stack_fffffffffffffbe8);
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_70);
      *puVar5 = '\x02';
      local_220 = (BlobInfo *)0x0;
      do {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_01->_pointX,(size_type)local_220);
        vVar1 = *pvVar6;
        pBVar7 = (BlobInfo *)
                 ((long)&(local_220->_pointX).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_01->_pointY,(size_type)local_220);
        vVar2 = *pvVar6;
        local_229 = '\0';
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12a55c);
        puVar8 = puVar8 + (((ulong)((vVar1 + 1) - local_3a._38_4_) +
                           (ulong)(((vVar2 + 1) - local_3a._34_4_) * local_64)) - (ulong)local_64);
        puVar4 = puVar8 + -1;
        if (*puVar4 != '\0') {
          if (*puVar4 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            *puVar4 = '\x02';
          }
          local_229 = '\x01';
        }
        if (*puVar8 != '\0') {
          if (*puVar8 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            *puVar8 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        puVar8 = puVar8 + 1;
        if (*puVar8 != '\0') {
          if (*puVar8 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            *puVar8 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        puVar8 = puVar8 + (uint)local_3a._30_4_;
        if (*puVar8 != '\0') {
          if (*puVar8 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
            *puVar8 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        puVar8 = puVar8 + 2;
        if (*puVar8 != '\0') {
          if (*puVar8 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
            *puVar8 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        puVar8 = puVar8 + (uint)local_3a._30_4_;
        if (*puVar8 != '\0') {
          if (*puVar8 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            *puVar8 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        puVar4 = puVar8 + 1;
        if (*puVar4 != '\0') {
          if (*puVar4 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            *puVar4 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        puVar4 = puVar8 + 2;
        if (*puVar4 != '\0') {
          if (*puVar4 == '\x01') {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&in_stack_fffffffffffffbf0->_pointX,
                       (value_type_conflict3 *)in_stack_fffffffffffffbe8);
            *puVar4 = '\x02';
          }
          local_229 = local_229 + '\x01';
        }
        if (local_229 != '\b') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
          puVar8[1 - (ulong)local_64] = '\x03';
        }
        in_stack_fffffffffffffc30._M_node = (_List_node_base *)pBVar7;
        pBVar9 = (BlobInfo *)
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this_01->_pointX);
        local_220 = pBVar7;
      } while ((BlobInfo *)in_stack_fffffffffffffc30._M_node != pBVar9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_stack_fffffffffffffbf0->_pointX,
                 (value_type_conflict3 *)in_stack_fffffffffffffbe8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&in_stack_fffffffffffffbf0->_pointX,
                 (value_type_conflict3 *)in_stack_fffffffffffffbe8);
      local_220 = (BlobInfo *)0x0;
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_70);
      *puVar5 = '\x04';
      do {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_01->_contourX,(size_type)local_220);
        vVar1 = *pvVar6;
        p_Var10 = (_List_node_base *)((long)&local_220->_pointX + 1);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this_01->_contourY,(size_type)local_220);
        vVar2 = *pvVar6;
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12ac47);
        puVar4 = puVar4 + (((ulong)((vVar1 + 1) - local_3a._38_4_) +
                           (ulong)(((vVar2 + 1) - local_3a._34_4_) * local_64)) - (ulong)local_64);
        if (puVar4[-1] == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          puVar4[-1] = '\x04';
        }
        if (*puVar4 == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          *puVar4 = '\x04';
        }
        puVar4 = puVar4 + 1;
        if (*puVar4 == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          *puVar4 = '\x04';
        }
        puVar4 = puVar4 + (uint)local_3a._30_4_;
        if (*puVar4 == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
          *puVar4 = '\x04';
        }
        puVar4 = puVar4 + 2;
        if (*puVar4 == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
          *puVar4 = '\x04';
        }
        puVar4 = puVar4 + (uint)local_3a._30_4_;
        if (*puVar4 == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          *puVar4 = '\x04';
        }
        if (puVar4[1] == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffc00,(value_type_conflict3 *)in_stack_fffffffffffffbf8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          puVar4[1] = '\x04';
        }
        if (puVar4[2] == '\x03') {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&in_stack_fffffffffffffbf0->_pointX,
                     (value_type_conflict3 *)in_stack_fffffffffffffbe8);
          puVar4[2] = '\x04';
        }
        in_stack_fffffffffffffc28._M_node = p_Var10;
        p_Var11 = (_List_node_base *)
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&this_01->_contourX);
        local_220 = (BlobInfo *)p_Var10;
      } while (in_stack_fffffffffffffc28._M_node != p_Var11);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_70);
  }
  if (((in_stack_00000020 & 1) != 0) || ((in_stack_00000010 & 1) != 0)) {
    in_stack_fffffffffffffc20 =
         (vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)local_b0;
    iVar12 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::begin(in_stack_fffffffffffffbe8);
    iVar13 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::end(in_stack_fffffffffffffbe8);
    std::
    for_each<std::_List_iterator<Blob_Detection::BlobInfo>,Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__0>
              (iVar12._M_node,iVar13._M_node);
    std::__cxx11::list<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
    remove_if<Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__1>
              (this_00,__pred);
  }
  if (((in_stack_00000040 & 1) != 0) || ((in_stack_00000030 & 1) != 0)) {
    in_stack_fffffffffffffc18 = (allocator_type *)local_b0;
    iVar12 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::begin(in_stack_fffffffffffffbe8);
    iVar13 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::end(in_stack_fffffffffffffbe8);
    std::
    for_each<std::_List_iterator<Blob_Detection::BlobInfo>,Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__2>
              (iVar12._M_node,iVar13._M_node);
    std::__cxx11::list<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
    remove_if<Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__3>
              (this_00,__pred);
  }
  if (((in_stack_00000054 & 1) != 0) || ((in_stack_0000004c & 1) != 0)) {
    iVar12 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::begin(in_stack_fffffffffffffbe8);
    iVar13 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::end(in_stack_fffffffffffffbe8);
    std::
    for_each<std::_List_iterator<Blob_Detection::BlobInfo>,Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__4>
              (iVar12._M_node,iVar13._M_node);
    std::__cxx11::list<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
    remove_if<Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__5>
              (this_00,__pred);
  }
  if (((in_stack_00000070 & 1) != 0) || ((in_stack_00000060 & 1) != 0)) {
    iVar12 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::begin(in_stack_fffffffffffffbe8);
    iVar13 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::end(in_stack_fffffffffffffbe8);
    std::
    for_each<std::_List_iterator<Blob_Detection::BlobInfo>,Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__6>
              (iVar12._M_node,iVar13._M_node);
    std::__cxx11::list<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
    remove_if<Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__7>
              (this_00,__pred);
  }
  if (((in_stack_00000084 & 1) != 0) || ((in_stack_0000007c & 1) != 0)) {
    std::__cxx11::list<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
    remove_if<Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__8>
              (this_00,__pred);
  }
  if (((in_stack_00000094 & 1) != 0) || ((in_stack_0000008c & 1) != 0)) {
    in_stack_fffffffffffffc00 = (ImageTemplate<unsigned_char> *)local_b0;
    iVar12 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::begin(in_stack_fffffffffffffbe8);
    iVar13 = std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
             ::end(in_stack_fffffffffffffbe8);
    std::
    for_each<std::_List_iterator<Blob_Detection::BlobInfo>,Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__9>
              (iVar12._M_node,iVar13._M_node);
    std::__cxx11::list<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
    remove_if<Blob_Detection::BlobDetection::find(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,unsigned_int,unsigned_int,Blob_Detection::BlobParameters,unsigned_char)::__10>
              (this_00,__pred);
  }
  pvVar14 = (vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)local_b0;
  std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::begin
            (in_stack_fffffffffffffbe8);
  std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::end
            (in_stack_fffffffffffffbe8);
  std::allocator<Blob_Detection::BlobInfo>::allocator
            ((allocator<Blob_Detection::BlobInfo> *)0x12b386);
  std::vector<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>::
  vector<std::_List_iterator<Blob_Detection::BlobInfo>,void>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc18);
  std::allocator<Blob_Detection::BlobInfo>::~allocator
            ((allocator<Blob_Detection::BlobInfo> *)0x12b3b7);
  std::swap<Blob_Detection::BlobInfo,std::allocator<Blob_Detection::BlobInfo>>
            (pvVar14,(vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                     in_stack_fffffffffffffbe8);
  pvVar14 = get(in_RDI);
  std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
            ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
             in_stack_fffffffffffffc00);
  std::__cxx11::list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~list
            ((list<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)0x12b3f3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc00);
  return pvVar14;
}

Assistant:

const std::vector < BlobInfo > & BlobDetection::find( const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width,
                                                          uint32_t height, BlobParameters parameter, uint8_t threshold )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );

        parameter._verify();

        _blob.clear();

        // we make the area by 2 pixels bigger in each direction so we don't need to check borders of map
        std::vector < uint8_t > imageMap( (width + 2) * (height + 2), EMPTY );

        uint32_t rowSize = image.rowSize();

        const uint8_t * imageY    = image.data() + y * rowSize + x;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        const uint32_t mapWidth = width + 2;

        std::vector < uint8_t >::iterator mapValueX = imageMap.begin() + mapWidth + 1;

        for( ; imageY != imageYEnd; imageY += rowSize, mapValueX += mapWidth ) {
            const uint8_t * imageX    = imageY;
            const uint8_t * imageXEnd = imageX + width;

            std::vector < uint8_t >::iterator mapValueY = mapValueX;

            for( ; imageX != imageXEnd; ++imageX, ++mapValueY ) {
                if( (*imageX) >= threshold )
                    *mapValueY = NOT_IN_USE;
            }
        }

        // find all blobs
        std::list < BlobInfo > foundBlob;

        mapValueX = imageMap.begin() + mapWidth;
        std::vector < uint8_t >::const_iterator endMap = imageMap.end() - mapWidth;

        for( ; mapValueX != endMap; ++mapValueX ) {
            if( *mapValueX == NOT_IN_USE ) { // blob found!
                foundBlob.push_back( BlobInfo() );

                BlobInfo & newBlob = foundBlob.back();

                uint32_t relativePosition = static_cast<uint32_t>(mapValueX - imageMap.begin());

                std::vector < uint32_t > & pointX = newBlob._pointX;
                std::vector < uint32_t > & pointY = newBlob._pointY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                pointX.push_back( relativePosition % mapWidth + x - 1 );
                pointY.push_back( relativePosition / mapWidth + y - 1 );

                std::vector < uint32_t > & edgeX = newBlob._edgeX;
                std::vector < uint32_t > & edgeY = newBlob._edgeY;

                *mapValueX = FOUND;

                size_t pointId = 0;

                do {
                    uint32_t xMap = pointX[pointId];
                    uint32_t yMap = pointY[pointId++];

                    uint8_t neighbourCount = 0;

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap - 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + 2;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap - 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    ++position;
                    if( *(position) != EMPTY ) {
                        if( *(position) == NOT_IN_USE ) {
                            pointX.push_back( xMap + 1 );
                            pointY.push_back( yMap + 1 );
                            *(position) = FOUND;
                        }
                        ++neighbourCount;
                    }

                    if( neighbourCount != 8 ) {
                        edgeX.push_back( xMap );
                        edgeY.push_back( yMap );
                        *(position - 1 - mapWidth) = EDGE;
                    }
                } while( pointId != pointX.size() );

                // Now we can extract outer edge points or so called contour points
                std::vector < uint32_t > & contourX = newBlob._contourX;
                std::vector < uint32_t > & contourY = newBlob._contourY;

                // we put extra shift [-1, -1] to point position because our map starts from [1, 1]
                // not from [0, 0]
                contourX.push_back( relativePosition % mapWidth + x - 1 );
                contourY.push_back( relativePosition / mapWidth + y - 1 );

                pointId = 0;

                *mapValueX = CONTOUR;

                do {
                    uint32_t xMap = contourX[pointId];
                    uint32_t yMap = contourY[pointId++];

                    uint8_t * position = imageMap.data() + (yMap + 1 - y) * mapWidth + (xMap + 1 - x);

                    position = position - mapWidth - 1;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap - 1 );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + 2;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap );
                        *(position) = CONTOUR;
                    }

                    position = position + width; // (mapWidth - 2) is width
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap - 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }

                    ++position;
                    if( *(position) == EDGE ) {
                        contourX.push_back( xMap + 1 );
                        contourY.push_back( yMap + 1 );
                        *(position) = CONTOUR;
                    }
                } while( pointId != contourX.size() );
            }
        }

        // All blobs found. Now we need to sort them
        if( parameter.circularity.checkMaximum || parameter.circularity.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getCircularity(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.circularity.checkMaximum && info.circularity() > parameter.circularity.maximum) ||
                       (parameter.circularity.checkMinimum && info.circularity() < parameter.circularity.minimum); } );
        }

        if( parameter.elongation.checkMaximum || parameter.elongation.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getElongation(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.elongation.checkMaximum && info.elongation() > parameter.elongation.maximum) ||
                       (parameter.elongation.checkMinimum && info.elongation() < parameter.elongation.minimum); } );
        }

        if( parameter.height.checkMaximum || parameter.height.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getHeight(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.height.checkMaximum && info.height() > parameter.height.maximum) ||
                       (parameter.height.checkMinimum && info.height() < parameter.height.minimum); } );
        }

        if( parameter.length.checkMaximum || parameter.length.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getLength(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.length.checkMaximum && info.length() > parameter.length.maximum) ||
                       (parameter.length.checkMinimum && info.length() < parameter.length.minimum); } );
        }

        if( parameter.size.checkMaximum || parameter.size.checkMinimum ) {
            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.size.checkMaximum && info.size() > parameter.size.maximum) ||
                       (parameter.size.checkMinimum && info.size() < parameter.size.minimum); } );
        }

        if( parameter.width.checkMaximum || parameter.width.checkMinimum ) {
            std::for_each( foundBlob.begin(), foundBlob.end(), []( BlobInfo & info ) { info._getWidth(); } );

            foundBlob.remove_if( [&parameter]( const BlobInfo & info ) {
                return (parameter.width.checkMaximum && info.width() > parameter.width.maximum) ||
                       (parameter.width.checkMinimum && info.width() < parameter.width.minimum); } );
        }

        // prepare data for output
        std::vector <BlobInfo> blobTemp ( foundBlob.begin(), foundBlob.end() );
        std::swap( _blob, blobTemp );

        return get();
    }